

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmcG.c
# Opt level: O1

void Bmcg_ManAddCnf(Bmcg_Man_t *p,bmcg_sat_solver *pSat,Cnf_Dat_t *pCnf)

{
  uint uVar1;
  int iVar2;
  int *plits;
  int iVar3;
  Gia_Man_t *pGVar4;
  Vec_Int_t *pVVar5;
  long lVar6;
  ulong uVar7;
  int iVar8;
  long lVar9;
  timespec ts;
  timespec local_40;
  
  iVar3 = clock_gettime(3,&local_40);
  if (iVar3 < 0) {
    lVar6 = 1;
  }
  else {
    lVar6 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_40.tv_nsec),8);
    lVar6 = ((lVar6 >> 7) - (lVar6 >> 0x3f)) + local_40.tv_sec * -1000000;
  }
  bmcg_sat_solver_set_nvars(pSat,p->nSatVars);
  if (p->pPars->fUseEliminate != 0) {
    uVar1 = p->nOldFrPis;
    uVar7 = (ulong)uVar1;
    pGVar4 = p->pFrames;
    pVVar5 = pGVar4->vCis;
    iVar3 = pVVar5->nSize;
    if ((int)uVar1 < iVar3 - pGVar4->nRegs) {
      do {
        if (((int)uVar1 < 0) || (iVar3 <= (int)uVar7)) goto LAB_00572428;
        iVar3 = pVVar5->pArray[uVar7];
        if (((long)iVar3 < 0) || (pGVar4->nObjs <= iVar3)) goto LAB_00572447;
        if ((p->vFr2Sat).nSize <= iVar3) goto LAB_00572428;
        iVar3 = (p->vFr2Sat).pArray[iVar3];
        if (0 < iVar3) {
          bmcg_sat_solver_var_set_frozen(pSat,iVar3,1);
        }
        uVar7 = uVar7 + 1;
        pGVar4 = p->pFrames;
        pVVar5 = pGVar4->vCis;
        iVar3 = pVVar5->nSize;
      } while ((int)uVar7 < iVar3 - pGVar4->nRegs);
    }
    uVar1 = p->nOldFrPos;
    uVar7 = (ulong)uVar1;
    pGVar4 = p->pFrames;
    pVVar5 = pGVar4->vCos;
    iVar3 = pVVar5->nSize;
    iVar2 = pGVar4->nRegs;
    iVar8 = iVar3 - iVar2;
    if ((int)uVar1 < iVar8) {
      do {
        if (((int)uVar1 < 0) || (iVar3 <= (int)uVar7)) {
LAB_00572428:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        iVar3 = pVVar5->pArray[uVar7];
        if (((long)iVar3 < 0) || (pGVar4->nObjs <= iVar3)) {
LAB_00572447:
          __assert_fail("v >= 0 && v < p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                        ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
        }
        if ((p->vFr2Sat).nSize <= iVar3) goto LAB_00572428;
        iVar3 = (p->vFr2Sat).pArray[iVar3];
        if (0 < iVar3) {
          bmcg_sat_solver_var_set_frozen(pSat,iVar3,1);
        }
        uVar7 = uVar7 + 1;
        pGVar4 = p->pFrames;
        pVVar5 = pGVar4->vCos;
        iVar3 = pVVar5->nSize;
        iVar2 = pGVar4->nRegs;
        iVar8 = iVar3 - iVar2;
      } while ((int)uVar7 < iVar8);
    }
    p->nOldFrPis = pGVar4->vCis->nSize - iVar2;
    p->nOldFrPos = iVar8;
  }
  lVar9 = 0;
  do {
    if (pCnf->nClauses <= lVar9) {
      if (p->pPars->fUseEliminate != 0) {
        bmcg_sat_solver_eliminate(pSat,0);
        if (0 < (p->vFr2Sat).nSize) {
          lVar9 = 0;
          do {
            iVar3 = (p->vFr2Sat).pArray[lVar9];
            if ((0 < iVar3) && (iVar3 = bmcg_sat_solver_var_is_elim(pSat,iVar3), iVar3 != 0)) {
              if ((p->vFr2Sat).nSize <= lVar9) {
                __assert_fail("i >= 0 && i < p->nSize",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                              ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
              }
              (p->vFr2Sat).pArray[lVar9] = -1;
            }
            lVar9 = lVar9 + 1;
          } while (lVar9 < (p->vFr2Sat).nSize);
        }
        iVar3 = clock_gettime(3,&local_40);
        if (iVar3 < 0) {
          lVar9 = -1;
        }
        else {
          lVar9 = local_40.tv_nsec / 1000 + local_40.tv_sec * 1000000;
        }
        p->timeSmp = p->timeSmp + lVar9 + lVar6;
      }
      return;
    }
    plits = pCnf->pClauses[lVar9];
    iVar3 = bmcg_sat_solver_addclause
                      (pSat,plits,(int)((ulong)((long)pCnf->pClauses[lVar9 + 1] - (long)plits) >> 2)
                      );
    lVar9 = lVar9 + 1;
  } while (iVar3 != 0);
  __assert_fail("0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcBmcG.c"
                ,0x15c,"void Bmcg_ManAddCnf(Bmcg_Man_t *, bmcg_sat_solver *, Cnf_Dat_t *)");
}

Assistant:

void Bmcg_ManAddCnf( Bmcg_Man_t * p, bmcg_sat_solver * pSat, Cnf_Dat_t * pCnf )
{
    int i, iSatVar;
    abctime clk = Abc_Clock();
    bmcg_sat_solver_set_nvars( pSat, p->nSatVars );
    if ( p->pPars->fUseEliminate )
    {
        for ( i = p->nOldFrPis; i < Gia_ManPiNum(p->pFrames); i++ )
        {
            Gia_Obj_t * pObj = Gia_ManPi( p->pFrames, i );
            int iSatVar = Vec_IntEntry( &p->vFr2Sat, Gia_ObjId(p->pFrames, pObj) );
            if ( iSatVar > 0 )
                bmcg_sat_solver_var_set_frozen( pSat, iSatVar, 1 );
        }
        for ( i = p->nOldFrPos; i < Gia_ManPoNum(p->pFrames); i++ )
        {
            Gia_Obj_t * pObj = Gia_ManPo( p->pFrames, i );
            int iSatVar = Vec_IntEntry( &p->vFr2Sat, Gia_ObjId(p->pFrames, pObj) );
            if ( iSatVar > 0 )
                bmcg_sat_solver_var_set_frozen( pSat, iSatVar, 1 );
        }
        p->nOldFrPis = Gia_ManPiNum(p->pFrames);
        p->nOldFrPos = Gia_ManPoNum(p->pFrames);
    }
    for ( i = 0; i < pCnf->nClauses; i++ )
        if ( !bmcg_sat_solver_addclause( pSat, pCnf->pClauses[i], pCnf->pClauses[i+1]-pCnf->pClauses[i] ) )
            assert( 0 );
    if ( !p->pPars->fUseEliminate )
        return;
    bmcg_sat_solver_eliminate( pSat, 0 );
    Vec_IntForEachEntry( &p->vFr2Sat, iSatVar, i )
        if ( iSatVar > 0 && bmcg_sat_solver_var_is_elim(pSat, iSatVar) )
            Vec_IntWriteEntry( &p->vFr2Sat, i, -1 );
    p->timeSmp += Abc_Clock() - clk;
}